

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_s128_30_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong idx_00;
  undefined1 (*in_RDX) [16];
  long in_RSI;
  ulong *in_RDI;
  undefined8 uVar7;
  undefined8 uVar8;
  uint i;
  word128 cval [2];
  word idx;
  block_t *Ablock;
  block_t *cblock;
  int local_31c;
  ulong local_318;
  ulong uStack_310;
  undefined1 local_308 [16];
  word local_2f8;
  undefined1 (*local_2f0) [16];
  ulong local_228;
  ulong uStack_220;
  ulong local_1d8;
  ulong uStack_1d0;
  ulong local_188;
  ulong uStack_180;
  ulong local_138;
  ulong uStack_130;
  ulong local_e8;
  ulong uStack_e0;
  
  local_2f8 = *(ulong *)(in_RSI + 8);
  idx_00 = local_2f8 >> 0x22;
  local_318 = *in_RDI;
  uStack_310 = in_RDI[1];
  uVar7 = *(undefined8 *)*in_RDX;
  uVar8 = *(undefined8 *)(*in_RDX + 8);
  auVar6 = *in_RDX;
  mm128_compute_mask(idx_00,0);
  auVar1._8_8_ = uVar8;
  auVar1._0_8_ = uVar7;
  auVar1 = vpand_avx(auVar6,auVar1);
  local_e8 = auVar1._0_8_;
  uStack_e0 = auVar1._8_8_;
  local_318 = local_318 ^ local_e8;
  uStack_310 = uStack_310 ^ uStack_e0;
  uVar7 = *(undefined8 *)in_RDX[1];
  uVar8 = *(undefined8 *)(in_RDX[1] + 8);
  auVar1 = in_RDX[1];
  mm128_compute_mask(idx_00,1);
  auVar6._8_8_ = uVar8;
  auVar6._0_8_ = uVar7;
  local_308 = vpand_avx(auVar1,auVar6);
  local_2f8 = local_2f8 >> 0x24;
  local_2f0 = in_RDX + 2;
  for (local_31c = 0x1c; local_31c != 0; local_31c = local_31c + -4) {
    uVar7 = *(undefined8 *)*local_2f0;
    uVar8 = *(undefined8 *)(*local_2f0 + 8);
    auVar1 = *local_2f0;
    mm128_compute_mask(local_2f8,0);
    auVar2._8_8_ = uVar8;
    auVar2._0_8_ = uVar7;
    auVar1 = vpand_avx(auVar1,auVar2);
    local_138 = auVar1._0_8_;
    uStack_130 = auVar1._8_8_;
    uVar7 = *(undefined8 *)local_2f0[1];
    uVar8 = *(undefined8 *)(local_2f0[1] + 8);
    auVar1 = local_2f0[1];
    mm128_compute_mask(local_2f8,1);
    auVar3._8_8_ = uVar8;
    auVar3._0_8_ = uVar7;
    auVar1 = vpand_avx(auVar1,auVar3);
    local_188 = auVar1._0_8_;
    uStack_180 = auVar1._8_8_;
    uVar7 = *(undefined8 *)local_2f0[2];
    uVar8 = *(undefined8 *)(local_2f0[2] + 8);
    auVar1 = local_2f0[2];
    mm128_compute_mask(local_2f8,2);
    auVar4._8_8_ = uVar8;
    auVar4._0_8_ = uVar7;
    auVar1 = vpand_avx(auVar1,auVar4);
    local_1d8 = auVar1._0_8_;
    uStack_1d0 = auVar1._8_8_;
    local_318 = local_318 ^ local_138 ^ local_1d8;
    uStack_310 = uStack_310 ^ uStack_130 ^ uStack_1d0;
    uVar7 = *(undefined8 *)local_2f0[3];
    uVar8 = *(undefined8 *)(local_2f0[3] + 8);
    auVar1 = local_2f0[3];
    mm128_compute_mask(local_2f8,3);
    auVar5._8_8_ = uVar8;
    auVar5._0_8_ = uVar7;
    auVar1 = vpand_avx(auVar1,auVar5);
    local_228 = auVar1._0_8_;
    uStack_220 = auVar1._8_8_;
    local_308._8_8_ = local_308._8_8_ ^ uStack_180 ^ uStack_220;
    local_308._0_8_ = local_308._0_8_ ^ local_188 ^ local_228;
    local_2f8 = local_2f8 >> 4;
    local_2f0 = local_2f0 + 4;
  }
  *in_RDI = local_318 ^ local_308._0_8_;
  in_RDI[1] = uStack_310 ^ local_308._8_8_;
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_addmul_v_s128_30_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);
  word idx              = CONST_BLOCK(v, 0)->w64[1] >> 34;

  word128 cval[2];
  cval[0] = mm128_xor_mask(mm128_load(cblock->w64), mm128_load(&Ablock[0].w64[0]),
                           mm128_compute_mask(idx, 0));
  cval[1] = mm128_and(mm128_load(&Ablock[0].w64[2]), mm128_compute_mask(idx, 1));
  idx >>= 2;
  Ablock += 1;

  for (unsigned int i = 28; i; i -= 4, idx >>= 4, Ablock += 2) {
    cval[0] = mm128_xor_mask(cval[0], mm128_load(&Ablock[0].w64[0]), mm128_compute_mask(idx, 0));
    cval[1] = mm128_xor_mask(cval[1], mm128_load(&Ablock[0].w64[2]), mm128_compute_mask(idx, 1));
    cval[0] = mm128_xor_mask(cval[0], mm128_load(&Ablock[1].w64[0]), mm128_compute_mask(idx, 2));
    cval[1] = mm128_xor_mask(cval[1], mm128_load(&Ablock[1].w64[2]), mm128_compute_mask(idx, 3));
  }
  mm128_store(cblock->w64, mm128_xor(cval[0], cval[1]));
}